

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::read_write
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp MVar1;
  MicroOp __args;
  MicroOp __args_00;
  
  if (type == Write) {
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
    __args_00 = CycleStoreIncrementData;
    __args = CycleStoreData;
    MVar1 = CycleStoreData;
    if (is8bit) goto LAB_0038ef69;
  }
  else {
    __args_00 = CycleFetchData;
    MVar1 = OperationPerform;
    if (!is8bit) {
      std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementData);
    }
  }
  __args = MVar1;
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,__args_00);
LAB_0038ef69:
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,__args);
  return;
}

Assistant:

static void read_write(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		if(type == AccessType::Write) {
			target(OperationPerform);						// Perform operation to fill the data buffer.
			if(!is8bit) target(CycleStoreIncrementData);	// Data low.
			target(CycleStoreData);							// Data [high].
		} else {
			if(!is8bit) target(CycleFetchIncrementData);	// Data low.
			target(CycleFetchData);							// Data [high].
			target(OperationPerform);						// Perform operation from the data buffer.
		}
	}